

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleMesh.cpp
# Opt level: O0

void __thiscall btTriangleMesh::preallocateVertices(btTriangleMesh *this,int numverts)

{
  long in_RDI;
  btAlignedObjectArray<btVector3> *unaff_retaddr;
  int _Count;
  
  _Count = (int)((ulong)in_RDI >> 0x20);
  if ((*(byte *)(in_RDI + 0xe9) & 1) == 0) {
    btAlignedObjectArray<float>::reserve((btAlignedObjectArray<float> *)unaff_retaddr,_Count);
  }
  else {
    btAlignedObjectArray<btVector3>::reserve(unaff_retaddr,_Count);
  }
  return;
}

Assistant:

void btTriangleMesh::preallocateVertices(int numverts)
{
	if (m_use4componentVertices)
	{
		m_4componentVertices.reserve(numverts);
	} else
	{
		m_3componentVertices.reserve(numverts);
	}
}